

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareProgram
          (GPUShaderFP64Test10 *this,functionObject *function_object,programInfo *out_program_info)

{
  GLuint n_varying_names_00;
  int iVar1;
  GLchar *vertex_shader_code;
  GLuint n_varying_names;
  programInfo *out_program_info_local;
  functionObject *function_object_local;
  GPUShaderFP64Test10 *this_local;
  
  n_varying_names_00 = (*function_object->_vptr_functionObject[5])();
  if (prepareProgram(gl4cts::GPUShaderFP64Test10::functionObject_const&,gl4cts::Utils::programInfo&)
      ::varying_names == '\0') {
    iVar1 = __cxa_guard_acquire(&prepareProgram(gl4cts::GPUShaderFP64Test10::functionObject_const&,gl4cts::Utils::programInfo&)
                                 ::varying_names);
    if (iVar1 != 0) {
      prepareProgram::varying_names[0] = getVaryingName(this,0);
      prepareProgram::varying_names[1] = getVaryingName(this,1);
      prepareProgram::varying_names[2] = getVaryingName(this,2);
      __cxa_guard_release(&prepareProgram(gl4cts::GPUShaderFP64Test10::functionObject_const&,gl4cts::Utils::programInfo&)
                           ::varying_names);
    }
  }
  prepareVertexShaderCode(this,function_object);
  vertex_shader_code = (GLchar *)std::__cxx11::string::c_str();
  Utils::programInfo::build
            (out_program_info,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
             vertex_shader_code,prepareProgram::varying_names,n_varying_names_00);
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareProgram(const functionObject& function_object, Utils::programInfo& out_program_info)
{
	const glw::GLuint		  n_varying_names  = function_object.getResultCount();
	static const glw::GLchar* varying_names[3] = { getVaryingName(0), getVaryingName(1), getVaryingName(2) };

	prepareVertexShaderCode(function_object);

	out_program_info.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* tes */, m_vertex_shader_code.c_str(),
						   varying_names, n_varying_names);
}